

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_p_rob3.cpp
# Opt level: O3

void ComputeFk(IkReal *j,IkReal *eetrans,IkReal *eerot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  dVar1 = cos(*j);
  dVar2 = cos(j[1]);
  dVar3 = sin(j[2]);
  dVar4 = cos(j[2]);
  dVar5 = sin(j[1]);
  dVar6 = sin(j[3]);
  dVar7 = cos(j[3]);
  dVar8 = sin(*j);
  dVar9 = cos(j[5]);
  dVar10 = sin(j[5]);
  dVar11 = sin(j[4]);
  dVar12 = cos(j[4]);
  dVar14 = dVar2 * dVar3;
  dVar15 = dVar2 * dVar4;
  dVar3 = dVar3 * dVar5;
  dVar19 = dVar1 * dVar15 - dVar1 * dVar3;
  dVar18 = dVar19 * dVar7 - dVar6 * dVar8;
  dVar17 = (dVar1 * dVar3 - dVar1 * dVar15) * dVar6 - dVar7 * dVar8;
  dVar4 = dVar4 * dVar5;
  dVar16 = dVar14 + dVar4;
  dVar13 = dVar1 * (-dVar4 - dVar14);
  *eerot = dVar10 * dVar17 + dVar9 * (dVar18 * dVar12 + dVar11 * dVar13);
  eerot[1] = dVar9 * dVar17 + dVar10 * (dVar18 * -dVar12 + -dVar11 * dVar13);
  eerot[2] = dVar1 * dVar16 * dVar12 + dVar11 * dVar18;
  dVar18 = dVar1 * 0.40675;
  dVar20 = dVar8 * 0.40675;
  *eetrans = (dVar19 * dVar7 * 0.40675 - dVar6 * dVar20) * dVar11 +
             dVar1 * 0.3095 * dVar14 +
             dVar1 * 0.3095 * dVar4 +
             dVar1 * dVar5 * 0.29 + (dVar18 * dVar14 + dVar18 * dVar4) * dVar12;
  dVar19 = (-dVar4 - dVar14) * dVar8;
  dVar13 = dVar15 * dVar8 - dVar3 * dVar8;
  dVar17 = dVar7 * dVar13 + dVar6 * dVar1;
  dVar1 = dVar1 * dVar7 + dVar6 * (dVar3 * dVar8 + dVar15 * -dVar8);
  eerot[3] = (dVar11 * dVar19 + dVar12 * dVar17) * dVar9 + dVar1 * dVar10;
  eerot[4] = dVar1 * dVar9 + (-dVar11 * dVar19 - dVar17 * dVar12) * dVar10;
  eerot[5] = dVar16 * dVar8 * dVar12 + dVar11 * dVar17;
  eetrans[1] = (dVar13 * dVar7 * 0.40675 + dVar18 * dVar6) * dVar11 +
               dVar5 * 0.29 * dVar8 +
               dVar8 * 0.3095 * dVar14 +
               (dVar20 * dVar4 + dVar14 * dVar20) * dVar12 + dVar4 * dVar8 * 0.3095;
  dVar1 = (dVar3 - dVar15) * dVar11;
  eerot[6] = (-dVar16 * dVar7 * dVar12 + dVar1) * dVar9 + dVar16 * dVar6 * dVar10;
  eerot[7] = dVar16 * dVar6 * dVar9 + (-dVar12 * -dVar16 * dVar7 - dVar1) * dVar10;
  eerot[8] = (dVar15 - dVar3) * dVar12 - dVar16 * dVar7 * dVar11;
  eetrans[2] = dVar15 * 0.3095 +
               (dVar3 * -0.40675 + dVar15 * 0.40675) * dVar12 +
               dVar3 * -0.3095 +
               (dVar14 * -0.40675 + dVar4 * -0.40675) * dVar7 * dVar11 + dVar2 * 0.29 + 0.3625;
  return;
}

Assistant:

IKFAST_API void ComputeFk(const IkReal* j, IkReal* eetrans, IkReal* eerot) {
IkReal x0,x1,x2,x3,x4,x5,x6,x7,x8,x9,x10,x11,x12,x13,x14,x15,x16,x17,x18,x19,x20,x21,x22,x23,x24,x25,x26,x27,x28,x29,x30,x31,x32,x33,x34,x35,x36,x37,x38,x39,x40,x41,x42,x43,x44,x45,x46,x47;
x0=IKcos(j[0]);
x1=IKcos(j[1]);
x2=IKsin(j[2]);
x3=IKcos(j[2]);
x4=IKsin(j[1]);
x5=IKsin(j[3]);
x6=IKcos(j[3]);
x7=IKsin(j[0]);
x8=IKcos(j[5]);
x9=IKsin(j[5]);
x10=IKsin(j[4]);
x11=IKcos(j[4]);
x12=((1.0)*x11);
x13=((0.40675)*x0);
x14=((1.0)*x0);
x15=((1.0)*x10);
x16=((0.40675)*x7);
x17=((1.0)*x7);
x18=((0.3095)*x7);
x19=((0.3095)*x0);
x20=((0.40675)*x6);
x21=((0.29)*x4);
x22=(x3*x4);
x23=(x1*x2);
x24=(x1*x3);
x25=(x10*x6);
x26=(x2*x4);
x27=(x5*x7);
x28=((1.0)*x24);
x29=(x14*x26);
x30=(x17*x26);
x31=((((-1.0)*x28))+x26);
x32=((((1.0)*x23))+(((1.0)*x22)));
x33=((-1.0)*x32);
x34=(((x0*x24))+(((-1.0)*x29)));
x35=((((-1.0)*x30))+((x24*x7)));
x36=(x33*x6);
x37=(x32*x5);
x38=(x14*(((((-1.0)*x22))+(((-1.0)*x23)))));
x39=(x14*((x22+x23)));
x40=(x17*(((((-1.0)*x22))+(((-1.0)*x23)))));
x41=(x17*((x22+x23)));
x42=(x35*x6);
x43=(x10*x38);
x44=(((x34*x6))+(((-1.0)*x17*x5)));
x45=(((x0*x5))+x42);
x46=(((x5*(((((-1.0)*x14*x24))+x29))))+(((-1.0)*x17*x6)));
x47=(((x0*x6))+((x5*(((((-1.0)*x17*x24))+x30)))));
eerot[0]=(((x46*x9))+((x8*((((x11*x44))+x43)))));
eerot[1]=(((x46*x8))+((x9*(((((-1.0)*x12*x44))+(((-1.0)*x15*x38)))))));
eerot[2]=(((x10*x44))+((x11*x39)));
eetrans[0]=(((x0*x21))+((x11*((((x13*x23))+((x13*x22))))))+((x19*x22))+((x19*x23))+((x10*((((x20*x34))+(((-1.0)*x16*x5)))))));
eerot[3]=(((x8*((((x10*x40))+((x11*x45))))))+((x47*x9)));
eerot[4]=(((x47*x8))+((x9*(((((-1.0)*x15*x40))+(((-1.0)*x12*x45)))))));
eerot[5]=(((x10*x45))+((x11*x41)));
eetrans[1]=(((x11*((((x16*x22))+((x16*x23))))))+((x18*x22))+((x18*x23))+((x21*x7))+((x10*((((x20*x35))+((x13*x5)))))));
eerot[6]=(((x8*((((x10*x31))+((x11*x36))))))+((x37*x9)));
eerot[7]=(((x37*x8))+((x9*(((((-1.0)*x12*x36))+(((-1.0)*x15*x31)))))));
eerot[8]=(((x11*(((((-1.0)*x26))+x28))))+((x25*x33)));
eetrans[2]=((0.3625)+(((0.29)*x1))+((x25*(((((-0.40675)*x23))+(((-0.40675)*x22))))))+(((-0.3095)*x26))+((x11*(((((-0.40675)*x26))+(((0.40675)*x24))))))+(((0.3095)*x24)));
}